

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall MPLSParser::composePlayListMark(MPLSParser *this,BitStreamWriter *writer)

{
  pointer pPVar1;
  int iVar2;
  uint *puVar3;
  uint value;
  uint32_t uVar4;
  int iVar5;
  PlayListMark *i;
  pointer pPVar6;
  int iVar7;
  uint local_78 [2];
  uint *local_70;
  ulong local_68;
  uint *local_60;
  ulong local_58;
  uint *local_50;
  uint *local_48;
  MPLSStreamInfo *local_40;
  int local_34;
  
  local_50 = (writer->super_BitStream).m_buffer;
  local_48 = (writer->super_BitStream).m_initBuffer;
  local_58 = (ulong)writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x20,0);
  local_60 = (writer->super_BitStream).m_buffer;
  local_70 = (writer->super_BitStream).m_initBuffer;
  local_68 = (ulong)writer->m_bitWrited;
  local_40 = getMainStream(this);
  if ((this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (this->m_chapterLen == 0) {
      local_34 = -1;
      std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int&>
                ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,&local_34,
                 &this->IN_time);
    }
    else {
      for (local_78[0] = this->IN_time; local_78[0] < this->OUT_time;
          local_78[0] = this->m_chapterLen * 45000 + local_78[0]) {
        local_78[1] = 0xffffffff;
        std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int&>
                  ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,
                   (int *)(local_78 + 1),local_78);
      }
    }
  }
  BitStreamWriter::putBits
            (writer,0x10,
             (uint)((ulong)((long)(this->m_marks).
                                  super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_marks).
                                 super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3));
  pPVar1 = (this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar6 = (this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 = local_48, pPVar6 != pPVar1;
      pPVar6 = pPVar6 + 1) {
    BitStreamWriter::putBits(writer,8,0);
    BitStreamWriter::putBits(writer,8,1);
    value = pPVar6->m_playItemID;
    if ((int)value < 0) {
      value = calcPlayItemID(local_40,pPVar6->m_markTime * 2);
    }
    BitStreamWriter::putBits(writer,0x10,value);
    BitStreamWriter::putBits(writer,0x20,pPVar6->m_markTime);
    BitStreamWriter::putBits(writer,0x10,0xffff);
    BitStreamWriter::putBits(writer,0x20,0);
  }
  iVar5 = (int)local_50;
  iVar7 = (int)local_48;
  iVar2 = (int)local_58;
  uVar4 = my_ntohl(((int)local_68 + ((int)local_60 - (int)local_70) * 8) / -8 +
                   (int)((*(int *)&(writer->super_BitStream).m_buffer -
                         *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited)
                   / 8);
  *(uint32_t *)((long)puVar3 + (long)((iVar2 + (iVar5 - iVar7) * 8) / 8)) = uVar4;
  return;
}

Assistant:

void MPLSParser::composePlayListMark(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    const MPLSStreamInfo& streamInfo = getMainStream();
    if (m_marks.empty())
    {
        if (m_chapterLen == 0)
            m_marks.emplace_back(-1, IN_time);
        else
        {
            for (uint32_t i = IN_time; i < OUT_time; i += m_chapterLen * 45000) m_marks.emplace_back(-1, i);
        }
    }
    writer.putBits(16, static_cast<unsigned>(m_marks.size()));
    for (const auto& i : m_marks)
    {
        writer.putBits(8, 0);  // reserved_for_future_use
        writer.putBits(8, 1);  // mark_type 0x01 = Chapter search
        if (i.m_playItemID >= 0)
            writer.putBits(16, i.m_playItemID);  // play item ID
        else
            writer.putBits(16, calcPlayItemID(streamInfo, i.m_markTime * 2));  // play item ID
        writer.putBits(32, i.m_markTime);
        writer.putBits(16, 0xffff);  // entry_ES_PID always 0xffff for mark_type 1
        writer.putBits(32, 0);       // duration always 0 for mark_type 1
    }
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}